

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::TreeEnsembleClassifier::MergeFrom
          (TreeEnsembleClassifier *this,TreeEnsembleClassifier *from)

{
  bool bVar1;
  TreeEnsemblePostEvaluationTransform TVar2;
  ClassLabelsCase CVar3;
  LogMessage *other;
  TreeEnsembleParameters *this_00;
  TreeEnsembleParameters *from_00;
  StringVector *this_01;
  StringVector *from_01;
  Int64Vector *this_02;
  Int64Vector *from_02;
  InternalMetadataWithArenaLite *this_03;
  LogFinisher local_a5;
  uint32 cached_has_bits;
  byte local_91;
  LogMessage local_90;
  TreeEnsembleClassifier *local_58;
  TreeEnsembleClassifier *from_local;
  TreeEnsembleClassifier *this_local;
  InternalMetadataWithArenaLite *local_40;
  InternalMetadataWithArenaLite *local_38;
  InternalMetadataWithArenaLite *local_30;
  InternalMetadataWithArenaLite *local_28;
  Container *local_20;
  InternalMetadataWithArenaLite *local_18;
  InternalMetadataWithArenaLite *local_10;
  
  local_91 = 0;
  local_58 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_90,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O0/mlmodel/format/TreeEnsemble.pb.cc"
               ,0x653);
    local_91 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_90,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_a5,other);
  }
  if ((local_91 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_90);
  }
  this_03 = &this->_internal_metadata_;
  this_local = (TreeEnsembleClassifier *)&local_58->_internal_metadata_;
  local_40 = this_03;
  local_38 = (InternalMetadataWithArenaLite *)this_local;
  local_30 = (InternalMetadataWithArenaLite *)this_local;
  if (((uint)(((InternalMetadataWithArenaLite *)this_local)->
             super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
             ).ptr_ & 1) == 1) {
    local_28 = (InternalMetadataWithArenaLite *)this_local;
    local_18 = (InternalMetadataWithArenaLite *)this_local;
    local_10 = (InternalMetadataWithArenaLite *)this_local;
    if (((uint)(((InternalMetadataWithArenaLite *)this_local)->
               super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
               ).ptr_ & 1) == 1) {
      local_20 = google::protobuf::internal::
                 InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>::Container>
                           ((InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                             *)this_local);
    }
    else {
      local_20 = (Container *)
                 google::protobuf::internal::InternalMetadataWithArenaLite::
                 default_instance_abi_cxx11_();
    }
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (this_03,&local_20->unknown_fields);
  }
  bVar1 = has_treeensemble(local_58);
  if (bVar1) {
    this_00 = mutable_treeensemble(this);
    from_00 = treeensemble(local_58);
    TreeEnsembleParameters::MergeFrom(this_00,from_00);
  }
  TVar2 = postevaluationtransform(local_58);
  if (TVar2 != NoTransform) {
    TVar2 = postevaluationtransform(local_58);
    set_postevaluationtransform(this,TVar2);
  }
  CVar3 = ClassLabels_case(local_58);
  if (CVar3 != CLASSLABELS_NOT_SET) {
    if (CVar3 == kStringClassLabels) {
      this_01 = mutable_stringclasslabels(this);
      from_01 = stringclasslabels(local_58);
      StringVector::MergeFrom(this_01,from_01);
    }
    else if (CVar3 == kInt64ClassLabels) {
      this_02 = mutable_int64classlabels(this);
      from_02 = int64classlabels(local_58);
      Int64Vector::MergeFrom(this_02,from_02);
    }
  }
  return;
}

Assistant:

void TreeEnsembleClassifier::MergeFrom(const TreeEnsembleClassifier& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.TreeEnsembleClassifier)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.has_treeensemble()) {
    mutable_treeensemble()->::CoreML::Specification::TreeEnsembleParameters::MergeFrom(from.treeensemble());
  }
  if (from.postevaluationtransform() != 0) {
    set_postevaluationtransform(from.postevaluationtransform());
  }
  switch (from.ClassLabels_case()) {
    case kStringClassLabels: {
      mutable_stringclasslabels()->::CoreML::Specification::StringVector::MergeFrom(from.stringclasslabels());
      break;
    }
    case kInt64ClassLabels: {
      mutable_int64classlabels()->::CoreML::Specification::Int64Vector::MergeFrom(from.int64classlabels());
      break;
    }
    case CLASSLABELS_NOT_SET: {
      break;
    }
  }
}